

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

bool __thiscall ot::commissioner::coap::Message::IsTokenEqual(Message *this,Message *aMessage)

{
  bool bVar1;
  ByteArray local_48;
  ByteArray local_30;
  Message *local_18;
  Message *aMessage_local;
  Message *this_local;
  
  local_18 = aMessage;
  aMessage_local = this;
  GetToken(&local_30,this);
  GetToken(&local_48,local_18);
  bVar1 = std::operator==(&local_30,&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_30);
  return bVar1;
}

Assistant:

bool Message::IsTokenEqual(const Message &aMessage) const
{
    return GetToken() == aMessage.GetToken();
}